

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_atomic_func_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  uint32_t result_id_00;
  SPIRType *pSVar1;
  CompilerError *this_00;
  char (*in_stack_ffffffffffffff60) [2];
  uint32_t result_id_local;
  string local_90;
  char *op_local;
  string local_68;
  string local_48;
  
  result_id_local = result_id;
  op_local = op;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  if (2 < pSVar1->basetype - Half) {
LAB_002e239c:
    ::std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&(this->super_Compiler).forced_temporaries,&result_id_local);
    result_id_00 = result_id_local;
    to_non_uniform_aware_expression_abi_cxx11_(&local_68,this,op0);
    to_unpacked_expression_abi_cxx11_(&local_48,this,op1,true);
    join<char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
              (&local_90,(spirv_cross *)&op_local,(char **)0x39e911,(char (*) [2])&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39b375,
               (char (*) [3])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
               in_stack_ffffffffffffff60);
    emit_op(this,result_type,result_id_00,&local_90,false,false);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_48);
    ::std::__cxx11::string::~string((string *)&local_68);
    Compiler::flush_all_atomic_capable_variables(&this->super_Compiler);
    return;
  }
  if ((this->options).vulkan_semantics == false) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Floating point atomics requires Vulkan semantics.");
  }
  else {
    if ((this->options).es != true) {
      ::std::__cxx11::string::string
                ((string *)&local_90,"GL_EXT_shader_atomic_float",(allocator *)&local_68);
      require_extension_internal(this,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      goto LAB_002e239c;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Floating point atomics requires desktop GLSL.");
  }
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_atomic_func_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	auto &type = get<SPIRType>(result_type);
	if (type_is_floating_point(type))
	{
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Floating point atomics requires Vulkan semantics.");
		if (options.es)
			SPIRV_CROSS_THROW("Floating point atomics requires desktop GLSL.");
		require_extension_internal("GL_EXT_shader_atomic_float");
	}

	forced_temporaries.insert(result_id);
	emit_op(result_type, result_id,
	        join(op, "(", to_non_uniform_aware_expression(op0), ", ",
	             to_unpacked_expression(op1), ")"), false);
	flush_all_atomic_capable_variables();
}